

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g80_atom64.cc
# Opt level: O0

int test_atom64(hwtest_ctx *ctx)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  uint64_t local_3038;
  uint64_t src3 [512];
  uint64_t src2 [512];
  uint64_t src1 [512];
  int op;
  uint32_t xtra;
  uint32_t op2;
  uint32_t op1;
  int i;
  hwtest_ctx *ctx_local;
  
  op2 = 0;
  do {
    if (99999 < (int)op2) {
      return 1;
    }
    lVar4 = jrand48(ctx->rand48);
    xtra = (uint)lVar4 & 0xfff0000 | 0xd0000011;
    uVar5 = jrand48(ctx->rand48);
    uVar1 = (uint)uVar5;
    op = uVar1 & 0x3f1ff03c | 0xc08007c0;
    lVar4 = jrand48(ctx->rand48);
    uVar2 = (uVar1 & 0x3c) >> 2;
    if ((uVar5 & 0x20000000) == 0) {
      if (uVar2 != 2) goto LAB_0036ebb3;
    }
    else {
      xtra = xtra & 0xff80fe03 | 0x40020;
      if (uVar2 == 2) {
        op = uVar1 & 0x3f00303c | 0xc08187c0;
      }
LAB_0036ebb3:
      if (uVar2 != 3) {
        iVar3 = atom64_prep_grid(ctx,(uint32_t)lVar4);
        if (iVar3 != 0) {
          return 3;
        }
        iVar3 = atom64_prep_code(ctx,xtra,op);
        if (iVar3 != 0) {
          return 3;
        }
        atom64_gen(ctx,src2 + 0x1ff,src3 + 0x1ff,&local_3038);
        iVar3 = atom64_test(ctx,xtra,op,src2 + 0x1ff,src3 + 0x1ff,&local_3038,(uint32_t)lVar4);
        if (iVar3 != 0) {
          return 3;
        }
      }
    }
    op2 = op2 + 1;
  } while( true );
}

Assistant:

static int test_atom64(struct hwtest_ctx *ctx) {
	int i;
	for (i = 0; i < 100000; i++) {
		uint32_t op1 = 0xd0000011 | (jrand48(ctx->rand48) & 0x0fff0000);
		uint32_t op2 = 0xc08007c0 | (jrand48(ctx->rand48) & 0x3f1ff03c);
		uint32_t xtra = jrand48(ctx->rand48);
		int op = op2 >> 2 & 0xf;
		if (op2 & 0x20000000) {
			/* if atom, use different operands than red */
			op1 &= ~0x7f01fc;
			op1 |= 0x040020;
			if (op == 2) {
				/* cas selected, aim the third source */
				op2 &= ~0x001fc000;
				op2 |= 0x00018000;
			}
		} else if (op == 2) {
			/* red cas selected, bail */
			continue;
		}
		/* op 3 is a trap */
		if (op == 3)
			continue;
		if (atom64_prep_grid(ctx, xtra))
			return HWTEST_RES_FAIL;
		if (atom64_prep_code(ctx, op1, op2))
				return HWTEST_RES_FAIL;
		uint64_t src1[0x200], src2[0x200], src3[0x200];
		atom64_gen(ctx, src1, src2, src3);
		if (atom64_test(ctx, op1, op2, src1, src2, src3, xtra))
			return HWTEST_RES_FAIL;
	}
	return HWTEST_RES_PASS;
}